

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

LSTMWeightParams * __thiscall
CoreML::Specification::LSTMWeightParams::New(LSTMWeightParams *this,Arena *arena)

{
  LSTMWeightParams *this_00;
  
  this_00 = (LSTMWeightParams *)operator_new(0x90);
  LSTMWeightParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LSTMWeightParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LSTMWeightParams* LSTMWeightParams::New(::google::protobuf::Arena* arena) const {
  LSTMWeightParams* n = new LSTMWeightParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}